

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

bool setFontWeightFromValue(Value *value,QFont *font)

{
  int iVar1;
  Weight weight;
  double dVar2;
  double dVar3;
  
  if (value->type == Number) {
    dVar2 = (double)QVariant::toDouble((bool *)&value->variant);
    dVar3 = 1001.0;
    if (dVar2 <= 1001.0) {
      dVar3 = dVar2;
    }
    if (dVar3 <= 0.0) {
      dVar3 = 0.0;
    }
    weight = (Weight)(dVar3 + 0.5);
  }
  else {
    if (value->type != KnownIdentifier) {
      return false;
    }
    iVar1 = QVariant::toInt((bool *)&value->variant);
    if (iVar1 == 1) {
      weight = Normal;
    }
    else {
      if (iVar1 != 0xd) {
        return false;
      }
      weight = Bold;
    }
  }
  QFont::setWeight(font,weight);
  return true;
}

Assistant:

static bool setFontWeightFromValue(const QCss::Value &value, QFont *font)
{
    if (value.type == Value::KnownIdentifier) {
        switch (value.variant.toInt()) {
            case Value_Normal: font->setWeight(QFont::Normal); return true;
            case Value_Bold: font->setWeight(QFont::Bold); return true;
            default: break;
        }
        return false;
    }
    if (value.type != Value::Number)
        return false;
    // .toInt() would call qRound64() and might overflow the long long there
    font->setWeight(QFont::Weight(qRound(qBound(0.0, value.variant.toDouble(), 1001.0))));
    return true;
}